

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O1

void test_init_start_stop_destroy_multiple_streams(int early,int delay_ms)

{
  uint uVar1;
  bool bVar2;
  stringstream *psVar3;
  int iVar4;
  anon_enum_32 *in_RCX;
  anon_enum_32 *actual;
  cubeb_stream **actual_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
  ;
  cubeb_stream **stream_00;
  cubeb *message;
  char *message_00;
  long lVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  int r;
  AssertionResult gtest_ar_2;
  AssertHelper local_b0;
  cubeb_stream_params local_a8;
  cubeb *ctx;
  uint local_7c;
  cubeb_stream *stream [8];
  
  r = common_init(&ctx,"test_sanity");
  local_a8._0_8_ = (ulong)local_a8.rate << 0x20;
  testing::internal::EqHelper<false>::Compare<int,__0>
            ((char *)stream,(char *)&r,(int *)&local_a8,in_RCX);
  if ((char)stream[0] == '\0') {
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (stream[1] == (cubeb_stream *)0x0) {
      message = (cubeb *)0x130db2;
    }
    else {
      message = stream[1]->context;
    }
    iVar4 = 0x119;
    local_a8._0_8_ = psVar3;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(stream + 1),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_a8.format = CUBEB_SAMPLE_S16LE;
    local_a8.rate = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)stream,"ctx","nullptr",&ctx,(void **)&local_a8);
    if ((char)stream[0] != '\0') {
      lVar5 = 0;
      local_7c = delay_ms;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(stream + 1),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
      local_a8._0_8_ = (stringstream *)0xac4400000000;
      local_a8.channels = 1;
      local_a8.layout = 4;
      local_a8.prefs = CUBEB_STREAM_PREF_NONE;
      do {
        stream_00 = (cubeb_stream **)((long)stream + lVar5);
        actual = (anon_enum_32 *)0x0;
        r = cubeb_stream_init(ctx,stream_00,"test",(cubeb_devid)0x0,(cubeb_stream_params *)0x0,
                              (cubeb_devid)0x0,&local_a8,0x113a,test_data_callback,
                              test_state_callback,&dummy);
        local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
        testing::internal::EqHelper<false>::Compare<int,__0>
                  (&gtest_ar_2.success_,(char *)&r,(int *)&local_d0,actual);
        if (gtest_ar_2.success_ == false) {
          psVar3 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar3);
          *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            message_00 = "";
          }
          else {
            message_00 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          iVar4 = 0x125;
          local_d0.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
          goto LAB_00109c91;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_2.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_d0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        actual_00 = stream_00;
        testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                  ((internal *)&gtest_ar_2,"stream[i]","nullptr",stream_00,&local_d0.ptr_);
        if (gtest_ar_2.success_ == false) {
          psVar3 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar3);
          *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            message_00 = "";
          }
          else {
            message_00 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          iVar4 = 0x126;
          local_d0.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
          goto LAB_00109c91;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_2.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (early != 0) {
          r = cubeb_stream_start(*stream_00);
          local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (&gtest_ar_2.success_,(char *)&r,(int *)&local_d0,(anon_enum_32 *)actual_00);
          if (gtest_ar_2.success_ == false) {
            psVar3 = (stringstream *)operator_new(0x188);
            std::__cxx11::stringstream::stringstream(psVar3);
            *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
            if (gtest_ar_2.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message_00 = "";
            }
            else {
              message_00 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
            }
            iVar4 = 0x129;
            local_d0.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
            goto LAB_00109c91;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar_2.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x40);
      if (early == 0) {
        lVar5 = 0;
        do {
          r = cubeb_stream_start(stream[lVar5]);
          local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (&gtest_ar_2.success_,(char *)&r,(int *)&local_d0,(anon_enum_32 *)actual_00);
          if (gtest_ar_2.success_ == false) {
            testing::Message::Message((Message *)&local_d0);
            if (gtest_ar_2.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message_00 = "";
            }
            else {
              message_00 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
            }
            iVar4 = 0x130;
            goto LAB_00109c91;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar_2.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 8);
      }
      uVar1 = local_7c;
      if (local_7c != 0) {
        sleep(local_7c / 1000);
        usleep((uVar1 % 1000) * 1000);
      }
      if (early == 0) {
        lVar5 = 0;
        do {
          r = cubeb_stream_stop(stream[lVar5]);
          local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (&gtest_ar_2.success_,(char *)&r,(int *)&local_d0,(anon_enum_32 *)actual_00);
          if (gtest_ar_2.success_ == false) {
            testing::Message::Message((Message *)&local_d0);
            if (gtest_ar_2.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message_00 = "";
            }
            else {
              message_00 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
            }
            iVar4 = 0x13b;
            goto LAB_00109c91;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar_2.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 8);
      }
      lVar5 = 0;
      do {
        if (early != 0) {
          r = cubeb_stream_stop(stream[lVar5]);
          local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (&gtest_ar_2.success_,(char *)&r,(int *)&local_d0,(anon_enum_32 *)actual_00);
          if (gtest_ar_2.success_ == false) {
            testing::Message::Message((Message *)&local_d0);
            if (gtest_ar_2.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message_00 = "";
            }
            else {
              message_00 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
            }
            iVar4 = 0x142;
LAB_00109c91:
            this = &gtest_ar_2.message_;
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                       ,iVar4,message_00);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_d0);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            if (local_d0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 (local_d0.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_d0.ptr_ + 8))();
              }
              local_d0.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
            goto LAB_00109cdb;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar_2.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        cubeb_stream_destroy(stream[lVar5]);
        lVar5 = lVar5 + 1;
        if (lVar5 == 8) {
          cubeb_destroy(ctx);
          return;
        }
      } while( true );
    }
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (stream[1] == (cubeb_stream *)0x0) {
      message = (cubeb *)0x130db2;
    }
    else {
      message = stream[1]->context;
    }
    iVar4 = 0x11a;
    local_a8._0_8_ = psVar3;
  }
  this = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(stream + 1);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_2,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
             ,iVar4,(char *)message);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
  if ((stringstream *)local_a8._0_8_ != (stringstream *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && ((stringstream *)local_a8._0_8_ != (stringstream *)0x0)) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
    local_a8._0_8_ = (stringstream *)0x0;
  }
LAB_00109cdb:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

static void
test_init_start_stop_destroy_multiple_streams(int early, int delay_ms)
{
  size_t i;
  int r;
  cubeb * ctx;
  cubeb_stream * stream[8];
  cubeb_stream_params params;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
    r = cubeb_stream_init(ctx, &stream[i], "test", NULL, NULL, NULL, &params, STREAM_LATENCY,
                          test_data_callback, test_state_callback, &dummy);
    ASSERT_EQ(r, CUBEB_OK);
    ASSERT_NE(stream[i], nullptr);
    if (early) {
      r = cubeb_stream_start(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  if (!early) {
    for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
      r = cubeb_stream_start(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  if (delay_ms) {
    delay(delay_ms);
  }

  if (!early) {
    for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
      r = cubeb_stream_stop(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
  }

  for (i = 0; i < ARRAY_LENGTH(stream); ++i) {
    if (early) {
      r = cubeb_stream_stop(stream[i]);
      ASSERT_EQ(r, CUBEB_OK);
    }
    cubeb_stream_destroy(stream[i]);
  }

  cubeb_destroy(ctx);
}